

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall duckdb::LogicalType::IsJSONType(LogicalType *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  string local_30;
  
  if (this->id_ == VARCHAR) {
    bVar1 = HasAlias(this);
    if (bVar1) {
      GetAlias_abi_cxx11_(&local_30,this);
      iVar2 = ::std::__cxx11::string::compare((char *)&local_30);
      bVar3 = iVar2 == 0;
      bVar1 = true;
      goto LAB_01421566;
    }
  }
  bVar1 = false;
  bVar3 = false;
LAB_01421566:
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2)) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool LogicalType::IsJSONType() const {
	return id() == LogicalTypeId::VARCHAR && HasAlias() && GetAlias() == JSON_TYPE_NAME;
}